

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O3

void ConvertARGBToY_C(uint32_t *argb,uint8_t *y,int width)

{
  uint uVar1;
  ulong uVar2;
  
  if (0 < width) {
    uVar2 = 0;
    do {
      uVar1 = argb[uVar2];
      y[uVar2] = (uint8_t)((uVar1 & 0xff) * 0x1914 + (uVar1 >> 0x10 & 0xff) * 0x41c7 +
                           (uVar1 >> 8 & 0xff) * 0x8123 + 0x108000 >> 0x10);
      uVar2 = uVar2 + 1;
    } while ((uint)width != uVar2);
  }
  return;
}

Assistant:

static void ConvertARGBToY_C(const uint32_t* argb, uint8_t* y, int width) {
  int i;
  for (i = 0; i < width; ++i) {
    const uint32_t p = argb[i];
    y[i] = VP8RGBToY((p >> 16) & 0xff, (p >> 8) & 0xff, (p >>  0) & 0xff,
                     YUV_HALF);
  }
}